

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O2

void __thiscall wasm::PrintSExpression::visitMemory(PrintSExpression *this,Memory *curr)

{
  char *pcVar1;
  ostream *poVar2;
  
  pcVar1 = (curr->super_Importable).module.super_IString.str._M_str;
  doIndent(this->o,this->indent);
  if (pcVar1 != (char *)0x0) {
    std::operator<<(this->o,'(');
    emitImportHeader(this,&curr->super_Importable);
    printMemoryHeader(this,curr);
    poVar2 = std::operator<<(this->o,')');
    std::operator<<(poVar2,this->maybeNewLine);
    return;
  }
  printMemoryHeader(this,curr);
  std::operator<<(this->o,'\n');
  return;
}

Assistant:

void PrintSExpression::visitMemory(Memory* curr) {
  if (curr->imported()) {
    doIndent(o, indent);
    o << '(';
    emitImportHeader(curr);
    printMemoryHeader(curr);
    o << ')' << maybeNewLine;
  } else {
    doIndent(o, indent);
    printMemoryHeader(curr);
    o << '\n';
  }
}